

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O2

void p_socket_address_set_scope_id(PSocketAddress *addr,puint32 scope_id)

{
  if ((addr != (PSocketAddress *)0x0) && (addr->family == P_SOCKET_FAMILY_INET6)) {
    addr->scope_id = scope_id;
  }
  return;
}

Assistant:

P_LIB_API void
p_socket_address_set_scope_id (PSocketAddress	*addr,
			       puint32		scope_id)
{
#if !defined (AF_INET6) || !defined (PLIBSYS_SOCKADDR_IN6_HAS_SCOPEID)
	P_UNUSED (addr);
	P_UNUSED (scope_id);
	return;
#else
	if (P_UNLIKELY (addr == NULL || addr->family != P_SOCKET_FAMILY_INET6))
		return;

	addr->scope_id = scope_id;
#endif
}